

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzmaEnc.c
# Opt level: O0

void LenPriceEnc_UpdateTables(CLenPriceEnc *p,uint numPosStates,CLenEnc *enc,CProbPrice *ProbPrices)

{
  ushort uVar1;
  CProbPrice CVar2;
  UInt32 startPrice;
  CProbPrice CVar3;
  uint uVar4;
  uint uVar5;
  size_t num;
  uint posState_1;
  uint prob_1;
  uint bit;
  UInt32 price;
  uint sym;
  UInt32 *prices_1;
  CLzmaProb *probs_1;
  uint i;
  CLzmaProb *probs;
  UInt32 *prices;
  uint posState;
  UInt32 c;
  UInt32 a;
  uint prob;
  UInt32 b;
  CProbPrice *ProbPrices_local;
  CLenEnc *enc_local;
  uint numPosStates_local;
  CLenPriceEnc *p_local;
  
  CVar2 = ProbPrices[(enc->low[0] ^ 0x7ff) >> 4];
  startPrice = ProbPrices[enc->low[0] >> 4];
  CVar3 = ProbPrices[(int)(uint)enc->low[8] >> 4];
  for (prices._4_4_ = 0; prices._4_4_ < numPosStates; prices._4_4_ = prices._4_4_ + 1) {
    SetPrices_3(enc->low + (prices._4_4_ << 4),startPrice,p->prices[prices._4_4_],ProbPrices);
    SetPrices_3(enc->low + (prices._4_4_ << 4) + 8,CVar2 + CVar3,p->prices[prices._4_4_] + 8,
                ProbPrices);
  }
  if (0x10 < p->tableSize) {
    CVar3 = ProbPrices[(int)(enc->low[8] ^ 0x7ff) >> 4];
    probs_1._4_4_ = p->tableSize - 0xf >> 1;
    do {
      uVar4 = probs_1._4_4_ - 1;
      bit = probs_1._4_4_ + 0x7f;
      prob_1 = CVar3 + CVar2;
      do {
        uVar5 = bit & 1;
        bit = bit >> 1;
        prob_1 = ProbPrices[((uint)enc->high[bit] ^ -uVar5 & 0x7ff) >> 4] + prob_1;
      } while (1 < bit);
      uVar1 = enc->high[(ulong)uVar4 + 0x80];
      p->prices[0][(ulong)uVar4 * 2 + 0x10] = prob_1 + ProbPrices[uVar1 >> 4];
      p->prices[0][(ulong)uVar4 * 2 + 0x11] = prob_1 + ProbPrices[(uVar1 ^ 0x7ff) >> 4];
      probs_1._4_4_ = uVar4;
    } while (uVar4 != 0);
    uVar4 = p->tableSize;
    for (num._4_4_ = 1; num._4_4_ < numPosStates; num._4_4_ = num._4_4_ + 1) {
      memcpy(p->prices[num._4_4_] + 0x10,p->prices[0] + 0x10,(ulong)(uVar4 - 0x10) << 2);
    }
  }
  return;
}

Assistant:

Z7_FASTCALL LenPriceEnc_UpdateTables(
    CLenPriceEnc *p,
    unsigned numPosStates,
    const CLenEnc *enc,
    const CProbPrice *ProbPrices)
{
  UInt32 b;
 
  {
    unsigned prob = enc->low[0];
    UInt32 a, c;
    unsigned posState;
    b = GET_PRICEa_1(prob);
    a = GET_PRICEa_0(prob);
    c = b + GET_PRICEa_0(enc->low[kLenNumLowSymbols]);
    for (posState = 0; posState < numPosStates; posState++)
    {
      UInt32 *prices = p->prices[posState];
      const CLzmaProb *probs = enc->low + (posState << (1 + kLenNumLowBits));
      SetPrices_3(probs, a, prices, ProbPrices);
      SetPrices_3(probs + kLenNumLowSymbols, c, prices + kLenNumLowSymbols, ProbPrices);
    }
  }

  /*
  {
    unsigned i;
    UInt32 b;
    a = GET_PRICEa_0(enc->low[0]);
    for (i = 0; i < kLenNumLowSymbols; i++)
      p->prices2[i] = a;
    a = GET_PRICEa_1(enc->low[0]);
    b = a + GET_PRICEa_0(enc->low[kLenNumLowSymbols]);
    for (i = kLenNumLowSymbols; i < kLenNumLowSymbols * 2; i++)
      p->prices2[i] = b;
    a += GET_PRICEa_1(enc->low[kLenNumLowSymbols]);
  }
  */
 
  // p->counter = numSymbols;
  // p->counter = 64;

  {
    unsigned i = p->tableSize;
    
    if (i > kLenNumLowSymbols * 2)
    {
      const CLzmaProb *probs = enc->high;
      UInt32 *prices = p->prices[0] + kLenNumLowSymbols * 2;
      i -= kLenNumLowSymbols * 2 - 1;
      i >>= 1;
      b += GET_PRICEa_1(enc->low[kLenNumLowSymbols]);
      do
      {
        /*
        p->prices2[i] = a +
        // RcTree_GetPrice(enc->high, kLenNumHighBits, i - kLenNumLowSymbols * 2, ProbPrices);
        LitEnc_GetPrice(probs, i - kLenNumLowSymbols * 2, ProbPrices);
        */
        // UInt32 price = a + RcTree_GetPrice(probs, kLenNumHighBits - 1, sym, ProbPrices);
        unsigned sym = --i + (1 << (kLenNumHighBits - 1));
        UInt32 price = b;
        do
        {
          const unsigned bit = sym & 1;
          sym >>= 1;
          price += GET_PRICEa(probs[sym], bit);
        }
        while (sym >= 2);

        {
          const unsigned prob = probs[(size_t)i + (1 << (kLenNumHighBits - 1))];
          prices[(size_t)i * 2    ] = price + GET_PRICEa_0(prob);
          prices[(size_t)i * 2 + 1] = price + GET_PRICEa_1(prob);
        }
      }
      while (i);

      {
        unsigned posState;
        const size_t num = (p->tableSize - kLenNumLowSymbols * 2) * sizeof(p->prices[0][0]);
        for (posState = 1; posState < numPosStates; posState++)
          memcpy(p->prices[posState] + kLenNumLowSymbols * 2, p->prices[0] + kLenNumLowSymbols * 2, num);
      }
    }
  }
}